

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

int __thiscall kj::ReadableDirectory::lstat(ReadableDirectory *this,char *__file,stat *__buf)

{
  NullableValue<kj::FsNode::Metadata> *other;
  Metadata *pMVar1;
  undefined8 in_RCX;
  Fault local_c0;
  Fault f;
  Maybe<kj::FsNode::Metadata> local_90;
  undefined1 local_58 [8];
  NullableValue<kj::FsNode::Metadata> meta;
  ReadableDirectory *this_local;
  PathPtr path_local;
  
  meta.field_1.value.hashCode = (uint64_t)__file;
  this_local = (ReadableDirectory *)__buf;
  (**(code **)(*(long *)__file + 0x48))(&local_90,__file,__buf,in_RCX);
  other = _::readMaybe<kj::FsNode::Metadata>(&local_90);
  _::NullableValue<kj::FsNode::Metadata>::NullableValue
            ((NullableValue<kj::FsNode::Metadata> *)local_58,other);
  Maybe<kj::FsNode::Metadata>::~Maybe(&local_90);
  pMVar1 = _::NullableValue::operator_cast_to_Metadata_((NullableValue *)local_58);
  if (pMVar1 == (Metadata *)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::PathPtr&>
              (&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x21e,FAILED,(char *)0x0,"\"no such file\", path",(char (*) [13])"no such file",
               (PathPtr *)&this_local);
    f.exception._0_4_ = 2;
    _::Debug::Fault::~Fault(&local_c0);
    memset(this,0,0x30);
    FsNode::Metadata::Metadata((Metadata *)this);
  }
  else {
    pMVar1 = _::NullableValue<kj::FsNode::Metadata>::operator*
                       ((NullableValue<kj::FsNode::Metadata> *)local_58);
    memcpy(this,pMVar1,0x30);
  }
  f.exception._0_4_ = 1;
  _::NullableValue<kj::FsNode::Metadata>::~NullableValue
            ((NullableValue<kj::FsNode::Metadata> *)local_58);
  return (int)this;
}

Assistant:

FsNode::Metadata ReadableDirectory::lstat(PathPtr path) const {
  KJ_IF_MAYBE(meta, tryLstat(path)) {
    return *meta;
  } else {
    KJ_FAIL_REQUIRE("no such file", path) { break; }